

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_binbuf.c
# Opt level: O0

void binbuf_add(_binbuf *x,int argc,t_atom *argv)

{
  int iVar1;
  undefined4 uVar2;
  int iVar3;
  t_atom *local_38;
  t_atom *ap;
  int i;
  int newsize;
  int previoussize;
  t_atom *argv_local;
  int argc_local;
  _binbuf *x_local;
  
  iVar1 = x->b_n;
  iVar3 = binbuf_resize(x,iVar1 + argc);
  if (iVar3 == 0) {
    pd_error((void *)0x0,"binbuf_addmessage: out of space");
  }
  else {
    local_38 = x->b_vec + iVar1;
    ap._4_4_ = argc;
    _newsize = argv;
    while (ap._4_4_ != 0) {
      uVar2 = *(undefined4 *)&_newsize->field_0x4;
      local_38->a_type = _newsize->a_type;
      *(undefined4 *)&local_38->field_0x4 = uVar2;
      local_38->a_w = _newsize->a_w;
      local_38 = local_38 + 1;
      ap._4_4_ = ap._4_4_ + -1;
      _newsize = _newsize + 1;
    }
  }
  return;
}

Assistant:

void binbuf_add(t_binbuf *x, int argc, const t_atom *argv)
{
    int previoussize = x->b_n;
    int newsize = previoussize + argc, i;
    t_atom *ap;

    if (!binbuf_resize(x, newsize))
    {
        pd_error(0, "binbuf_addmessage: out of space");
        return;
    }
#if 0
    startpost("binbuf_add: ");
    postatom(argc, argv);
    endpost();
#endif
    for (ap = x->b_vec + previoussize, i = argc; i--; ap++)
        *ap = *(argv++);
}